

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001855c0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001855c7 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001855b0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001855b8 = 0x2d2d2d2d2d2d2d;
    DAT_001855bf = 0x2d;
    _DAT_001855a0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001855a8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_00185590 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000185598 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000185588 = 0x2d2d2d2d2d2d2d2d;
    DAT_001855cf = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }